

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bozo.cpp
# Opt level: O3

void __thiscall Bozo::apply(Bozo *this,Vector *p,SurfaceData *t)

{
  double dVar1;
  Vector bozo_turb;
  Vector local_38;
  
  dVar1 = (this->super_Texture).turb;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    turbulence_3d(&local_38,p,(this->super_Texture).octaves);
    dVar1 = (this->super_Texture).turb;
    p->x = p->x + dVar1 * local_38.x;
    p->y = p->y + dVar1 * local_38.y;
    p->z = local_38.z * dVar1 + p->z;
  }
  dVar1 = noise(p);
  if ((this->tbl).color_entries == 0) {
    if (0.4 <= dVar1) {
      if (dVar1 < 0.6) {
        (t->color).y = (t->color).y + 1.0;
        return;
      }
      if (0.8 <= dVar1) {
        (t->color).x = (t->color).x + 1.0;
        return;
      }
    }
    else {
      (t->color).x = (t->color).x + 1.0;
      (t->color).y = (t->color).y + 1.0;
    }
    local_38.z = (t->color).z + 1.0;
  }
  else {
    ColorTable::find_color(&local_38,&this->tbl,dVar1);
    (t->color).x = (t->color).x + local_38.x;
    (t->color).y = (t->color).y + local_38.y;
    local_38.z = local_38.z + (t->color).z;
  }
  (t->color).z = local_38.z;
  return;
}

Assistant:

void Bozo::apply( Vector& p, Grayzer::SurfaceData& t )
{
   if(   turb !=  0.0   )
   {
      Vector bozo_turb = turbulence_3d( p, octaves );
      p += bozo_turb * turb;
   }

   double _noise =   noise(p);

   if(   !tbl.is_empty()   )
   {
      // in POV, found color is added  to existing object color; why __??
      t.color  += tbl.find_color(_noise);
      return;
   }

   if(   _noise < 0.4 )
   {
      t.color  += 1.0;
      return;
   }
   if(   _noise < 0.6 )
   {
      t.color.y += 1.0;
      return;
   }
   if(   _noise < 0.8 )
   {
      t.color.z += 1.0;
      return;
   }

   t.color.x += 1.0;
   return;
}